

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

TCGv_vec tcg_const_zeros_vec_aarch64(TCGContext_conflict1 *tcg_ctx,TCGType type)

{
  TCGv_vec r;
  TCGv_vec ret;
  TCGType type_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  r = tcg_temp_new_vec_aarch64(tcg_ctx,type);
  do_dupi_vec(tcg_ctx,r,3,0);
  return r;
}

Assistant:

TCGv_vec tcg_const_zeros_vec(TCGContext *tcg_ctx, TCGType type)
{
    TCGv_vec ret = tcg_temp_new_vec(tcg_ctx, type);
    do_dupi_vec(tcg_ctx, ret, MO_REG, 0);
    return ret;
}